

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

uint str_octal_to_uint(char *str)

{
  uint uVar1;
  byte bVar2;
  char *p;
  byte *pbVar3;
  
  bVar2 = *str;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(str + 1);
    uVar1 = 0;
    while (0xf7 < (byte)(bVar2 - 0x38)) {
      uVar1 = ((uint)bVar2 + uVar1 * 8) - 0x30;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      if (bVar2 == 0) {
        return uVar1;
      }
    }
  }
  return 0;
}

Assistant:

unsigned int str_octal_to_uint(const char *str) {
  unsigned int result = 0;
  const char *p = str;
  int non_zero_digit = 0;
  while (*p) {
    if (*p < '0' || *p > '7')
      return 0;
    if (*p != 0)
      non_zero_digit = 1;
    if (non_zero_digit != 0) {
      unsigned int val = *p - '0';
      result = result << 3;
      result += val;
    }
    ++p;
  }
  return result;
}